

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O0

void parseMap(char *loadDir,MapList *mapList,Dialog *dialog)

{
  bool bVar1;
  int iVar2;
  dirent *pdVar3;
  FILE *__stream;
  long lVar4;
  char *pcVar5;
  int local_1108;
  int local_1104;
  int i;
  int y;
  int x;
  _Bool firstRun;
  _Bool useCwd;
  char checkChar;
  char *textBox [3];
  char local_10d8 [8];
  char line [80];
  char path [4096];
  dirent *entry;
  Map *current;
  regex_t riotExt;
  DIR *directory;
  FILE *file;
  Dialog *dialog_local;
  MapList *mapList_local;
  char *loadDir_local;
  
  bVar1 = true;
  regcomp((regex_t *)&current,"(\\.)?[0-9](.riot)$",9);
  mapList->count = 0;
  mapList_local = (MapList *)loadDir;
  if (loadDir == (char *)0x0) {
    mapList_local = (MapList *)getcwd((char *)0x0,0x1000);
    strcat((char *)mapList_local,"/assets");
  }
  riotExt._56_8_ = opendir((char *)mapList_local);
  if ((DIR *)riotExt._56_8_ != (DIR *)0x0) {
    while (pdVar3 = readdir((DIR *)riotExt._56_8_), pdVar3 != (dirent *)0x0) {
      sprintf(line + 0x48,"%s/%s",mapList_local,pdVar3->d_name);
      iVar2 = regexec((regex_t *)&current,pdVar3->d_name,0,(regmatch_t *)0x0,0);
      if ((iVar2 == 0) && (__stream = fopen(line + 0x48,"r"), __stream != (FILE *)0x0)) {
        fseek(__stream,0,2);
        lVar4 = ftell(__stream);
        if (0x608 < lVar4) {
          rewind(__stream);
          if (pdVar3->d_name[0] == '.') {
            entry = (dirent *)(mapList->level + (pdVar3->d_name[1] + -0x30));
            *(int *)(entry->d_name + 0x35) = pdVar3->d_name[1] + -0x30;
          }
          else {
            entry = (dirent *)(mapList->level + (pdVar3->d_name[0] + -0x30));
            *(int *)(entry->d_name + 0x35) = pdVar3->d_name[0] + -0x30;
          }
          fgets(local_10d8,0x50,__stream);
          strtok(local_10d8,"]");
          pcVar5 = strtok((char *)0x0,"\n");
          strcpy((char *)entry,pcVar5);
          fgets(local_10d8,0x50,__stream);
          strtok(local_10d8,"]");
          pcVar5 = strtok((char *)0x0,"\n");
          iVar2 = atoi(pcVar5);
          *(int *)(entry[4].d_name + 0x79) = iVar2;
          fgets(local_10d8,0x50,__stream);
          strtok(local_10d8,"]");
          pcVar5 = strtok((char *)0x0,"\n");
          iVar2 = atoi(pcVar5);
          *(int *)(entry[4].d_name + 0x75) = iVar2;
          fgets(local_10d8,0x50,__stream);
          strtok(local_10d8,"]");
          pcVar5 = strtok((char *)0x0,"\n");
          strcpy(entry[4].d_name + 0x69,pcVar5);
          do {
            iVar2 = fgetc(__stream);
          } while (iVar2 == 0x3e);
          for (local_1104 = 0; local_1104 < 0x10; local_1104 = local_1104 + 1) {
            fgets(entry->d_name + (long)local_1104 * 0x49 + 0x39,0x48,__stream);
            fseek(__stream,2,1);
          }
          _x = dialog + *(int *)(entry->d_name + 0x35);
          textBox[0] = dialog[*(int *)(entry->d_name + 0x35)].textWin;
          textBox[1] = dialog[*(int *)(entry->d_name + 0x35)].textLose;
          for (local_1108 = 0; local_1108 < 3; local_1108 = local_1108 + 1) {
            i = 0;
            do {
              iVar2 = fgetc(__stream);
            } while ((char)iVar2 == '>');
            if ((char)iVar2 == '\0') {
              strcpy(*(char **)(&x + (long)local_1108 * 2),"");
            }
            else {
              while( true ) {
                iVar2 = fgetc(__stream);
                if ((char)iVar2 == '>') break;
                *(char *)(*(long *)(&x + (long)local_1108 * 2) + (long)i) = (char)iVar2;
                i = i + 1;
              }
            }
          }
          fclose(__stream);
          mapList->count = mapList->count + 1;
          bVar1 = false;
        }
      }
    }
  }
  closedir((DIR *)riotExt._56_8_);
  regfree((regex_t *)&current);
  if (loadDir == (char *)0x0) {
    free(mapList_local);
  }
  if (bVar1) {
    quit("No map files found");
  }
  return;
}

Assistant:

void parseMap(char *loadDir, struct MapList *mapList, struct Dialog *dialog) {

    FILE *file;
    DIR *directory;
    regex_t riotExt;

    struct Map *current;
    struct dirent *entry;

    char path[PATH_MAX];
    char line[MAX_COLS];
    char *textBox[3];
    char checkChar;
    bool useCwd = false;
    bool firstRun = true;

    int x, y;

    /* Compile regex */
    regcomp(&riotExt, REGEX_EXT, REG_NOSUB | REG_EXTENDED);

    /* Create a new mapList to store map file details */
    mapList->count = 0;

    /* Use map directory passed as argument if provided, else cwd */
    if (!loadDir) {
        loadDir = getcwd(loadDir, PATH_MAX);
        strcat(loadDir,"/assets");
        useCwd = true;
    }

    /* Attempt to iterate through files in loadDir */
    if ((directory = opendir(loadDir)))

        while ((entry = readdir(directory))) {
            sprintf(path, "%s/%s", loadDir, entry->d_name);

            /* Skip if not readable .riot# file */
            if (regexec(&riotExt, entry->d_name, 0, NULL, 0)) continue;
            if (!(file = fopen(path, "r"))) continue;
            fseek(file, 0, SEEK_END);
            if (ftell(file) < MAP_SIZE) continue;
            rewind(file);
            /* Determine level number from filename*/
            if (entry->d_name[0] == '.') {
                current = &mapList->level[entry->d_name[1] - '0'];
                current->levelNo = entry->d_name[1] - '0';
            } else {
                current = &mapList->level[entry->d_name[0] - '0'];
                current->levelNo = entry->d_name[0] - '0';
            }

            /* Get level name */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            strcpy(current->name, strtok(NULL, "\n"));

            /* Get rep */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            current->repMax = atoi(strtok(NULL, "\n"));

            /* Get panic */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            current->panicMax = atoi(strtok(NULL, "\n"));

            /* Get units */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            strcpy(current->inmates, strtok(NULL, "\n"));

            /* Get map */
            while ((fgetc(file) == '>'));
            for (y = 0; y < MAP_ROWS; y++) {
                fgets(current->overlay[y], MAP_COLS, file);
                fseek(file, 2, SEEK_CUR);
            }

            /* Get text boxes*/
            textBox[0] = dialog[current->levelNo].textIntro;
            textBox[1] = dialog[current->levelNo].textWin;
            textBox[2] = dialog[current->levelNo].textLose;

            for (int i = 0; i < 3; i++) {
                x = 0;
                do checkChar = fgetc(file); while (checkChar == '>');
                if (checkChar == '\0') strcpy(textBox[i], "");
                else
                    while ((checkChar = fgetc(file)) != '>') {
                        textBox[i][x++] = checkChar;
                    }
            }

            fclose(file);
            mapList->count++;
            firstRun = false;
        }

    /* Clean up memory */
    closedir(directory);
    regfree(&riotExt);
    if (useCwd) free(loadDir); //getcwd calls malloc, if used must free loadDir

    /* Terminate if no map files where found */
    if (firstRun) {
        quit("No map files found");
    }

    return;
}